

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.cpp
# Opt level: O2

path * __thiscall
hta::storage::file::Metric::path_hta_abi_cxx11_
          (path *__return_storage_ptr__,Metric *this,Duration interval)

{
  ostream *poVar1;
  string_type sStack_1e8;
  path local_1c8;
  stringstream ss;
  undefined1 local_190 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar1 = std::ostream::_M_insert<long>((long)local_190);
  std::operator<<(poVar1,".hta");
  std::__cxx11::stringbuf::str();
  std::filesystem::__cxx11::path::path(&local_1c8,&sStack_1e8,auto_format);
  Catch::clara::std::filesystem::__cxx11::operator/
            ((path *)__return_storage_ptr__,(path *)&this->path_,(path *)&local_1c8);
  Catch::clara::std::filesystem::__cxx11::path::~path((path *)&local_1c8);
  std::__cxx11::string::~string((string *)&sStack_1e8);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

std::filesystem::path Metric::path_hta(Duration interval)
{
    std::stringstream ss;
    ss << std::chrono::duration_cast<std::chrono::nanoseconds>(interval).count() << ".hta";
    return path_ / std::filesystem::path(ss.str());
}